

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O1

void __thiscall Statsd::UDPSender::sendToDaemon(UDPSender *this,string *message)

{
  undefined8 *puVar1;
  ushort uVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  ssize_t sVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint *puVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  char cVar12;
  ulong uVar13;
  uint __len;
  string __str;
  string __str_1;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar5 = sendto(this->m_socket,(message->_M_dataplus)._M_p,message->_M_string_length,0,
                 (sockaddr *)&this->m_server,0x10);
  if (sVar5 != -1) {
    return;
  }
  std::operator+(&local_50,"sendto server failed: host=",&this->m_host);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_110 = &local_100;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_100 = *puVar10;
    lStack_f8 = plVar6[3];
  }
  else {
    local_100 = *puVar10;
    local_110 = (ulong *)*plVar6;
  }
  local_108 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar2 = this->m_port;
  cVar12 = '\x01';
  if (((9 < uVar2) && (cVar12 = '\x02', 99 < uVar2)) && (cVar12 = '\x03', 999 < uVar2)) {
    cVar12 = '\x05' - (uVar2 < 10000);
  }
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,local_e8,(uint)uVar2);
  uVar11 = CONCAT44(uStack_e4,local_e8) + local_108;
  uVar13 = 0xf;
  if (local_110 != &local_100) {
    uVar13 = local_100;
  }
  if (uVar13 < uVar11) {
    uVar13 = 0xf;
    if (local_f0 != local_e0) {
      uVar13 = local_e0[0];
    }
    if (uVar13 < uVar11) goto LAB_00106a42;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00106a42:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
  }
  local_d0 = &local_c0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar7[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar7;
  }
  local_c8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_60 = *puVar10;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar10;
    local_70 = (ulong *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar8 = (uint *)__errno_location();
  uVar3 = *puVar8;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_00106b71;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_00106b71;
      }
      if (uVar9 < 10000) goto LAB_00106b71;
      uVar11 = uVar11 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_00106b71:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_90),__len,__val);
  uVar11 = 0xf;
  if (local_70 != &local_60) {
    uVar11 = local_60;
  }
  if (uVar11 < (ulong)(local_88 + local_68)) {
    uVar11 = 0xf;
    if (local_90 != local_80) {
      uVar11 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00106c24;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_00106c24:
  local_b0 = &local_a0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar7[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar7;
  }
  local_a8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void UDPSender::sendToDaemon(const std::string& message) noexcept {
    // Try sending the message
    const auto ret = sendto(m_socket,
                            message.data(),
#ifdef _WIN32
                            static_cast<int>(message.size()),
#else
                            message.size(),
#endif
                            0,
                            (struct sockaddr*)&m_server,
                            sizeof(m_server));
    if (ret == -1) {
        m_errorMessage = "sendto server failed: host=" + m_host + ":" +
                         std::to_string(static_cast<unsigned int>(m_port)) + ", err=" + std::to_string(SOCKET_ERRNO);
    }
}